

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_15::XmlReporter::log_contexts(XmlReporter *this)

{
  string *this_00;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_211;
  string *local_210;
  IContextScope **local_208;
  undefined1 local_200 [40];
  string local_1d8;
  stringstream ss;
  undefined1 local_1a8 [8];
  string local_1a0 [368];
  
  uVar1 = IReporter::get_num_active_contexts();
  if (uVar1 != 0) {
    local_208 = IReporter::get_active_contexts();
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    local_210 = (string *)&this->xml;
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    this_00 = (string *)(local_200 + 8);
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      (*local_208[uVar3]->_vptr_IContextScope[2])(local_208[uVar3],local_1a8);
      std::__cxx11::string::string<std::allocator<char>>(this_00,"Info",&local_211);
      XmlWriter::scopedElement((XmlWriter *)local_200,local_210);
      std::__cxx11::stringbuf::str();
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_200,&local_1d8,true);
      std::__cxx11::string::~string((string *)&local_1d8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_200);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::string<std::allocator<char>>(this_00,"",(allocator<char> *)&local_1d8);
      std::__cxx11::stringbuf::str(local_1a0);
      std::__cxx11::string::~string(this_00);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto              contexts = get_active_contexts();
                std::stringstream ss;
                for(int i = 0; i < num_contexts; ++i) {
                    contexts[i]->stringify(&ss);
                    xml.scopedElement("Info").writeText(ss.str());
                    ss.str("");
                }
            }
        }